

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highwayhash_test_target.cc
# Opt level: O2

uint64_t highwayhash::(anonymous_namespace)::RunHighwayCat<2u>(void *param_1,size_t size)

{
  ulong num_bytes;
  HHResult64 result;
  HighwayHashCatT<2U> cat;
  char in [1024];
  uint64_t local_548;
  HighwayHashCatT<2U> local_540;
  char local_470 [1104];
  
  HighwayHashCatT<2U>::HighwayHashCatT(&local_540,&anon_unknown_0::RunHighwayCat<2U>::key);
  local_470[0] = (char)size;
  num_bytes = size >> 1;
  HighwayHashCatT<2U>::Append(&local_540,local_470,num_bytes);
  HighwayHashCatT<2U>::Append(&local_540,local_470 + num_bytes,size - num_bytes);
  HighwayHashCatT<2U>::Finalize<unsigned_long>(&local_540,&local_548);
  return local_548;
}

Assistant:

uint64_t RunHighwayCat(const void*, const size_t size) {
  HH_ALIGNAS(32) static const HHKey key = {0, 1, 2, 3};
  HH_ALIGNAS(64) HighwayHashCatT<Target> cat(key);
  char in[kMaxBenchmarkInputSize];
  in[0] = static_cast<char>(size & 0xFF);
  const size_t half_size = size / 2;
  cat.Append(in, half_size);
  cat.Append(in + half_size, size - half_size);
  HHResult64 result;
  cat.Finalize(&result);
  return result;
}